

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

jh_off64_t __thiscall JetHead::File::getLength(File *this)

{
  int iVar1;
  stat64 file_status;
  
  iVar1 = fstat64(this->mFd,(stat64 *)&file_status);
  if (iVar1 == -1) {
    setError(this);
    file_status.st_size = -1;
  }
  return file_status.st_size;
}

Assistant:

jh_off64_t	File::getLength() const
{
	jh_stat64_t file_status;

	int res = jh_fstat64( mFd, &file_status );

	if ( res == -1 )
	{
		setError();
		return (jh_off64_t)-1;
	}

	return file_status.st_size;
}